

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_start.cxx
# Opt level: O2

int main(int argc,char **argv)

{
  int __how;
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l;
  allocator_type local_399;
  ptr<buffer> log;
  ptr<raft_server> server;
  __shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2> local_378;
  __shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2> local_368;
  ptr<logger> my_logger;
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> local_340;
  string msg;
  __shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2> local_300;
  __shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2> local_2f0;
  __shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2> local_2e0;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  local_2d0;
  undefined1 local_2b8 [52];
  undefined4 local_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined2 local_270;
  undefined4 local_26c;
  undefined2 local_268;
  undefined1 local_266;
  undefined4 local_264;
  undefined7 local_260;
  undefined1 uStack_259;
  undefined7 uStack_258;
  undefined1 local_250 [16];
  buffer_serializer bs_log;
  raft_launcher launcher;
  options asio_opt;
  
  my_logger.super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  my_logger.super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::make_shared<echo_state_machine>();
  local_368._M_ptr = (element_type *)asio_opt.thread_pool_size_;
  local_368._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       asio_opt.worker_start_.super__Function_base._M_functor._M_unused._0_8_;
  asio_opt.thread_pool_size_ = 0;
  asio_opt.worker_start_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&asio_opt.worker_start_);
  local_2b8._0_4_ = 1;
  std::make_shared<nuraft::inmem_state_mgr,int,char_const(&)[16]>
            ((int *)&asio_opt,(char (*) [16])local_2b8);
  local_378._M_ptr = (element_type *)asio_opt.thread_pool_size_;
  local_378._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       asio_opt.worker_start_.super__Function_base._M_functor._M_unused._0_8_;
  asio_opt.thread_pool_size_ = 0;
  asio_opt.worker_start_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&asio_opt.worker_start_);
  asio_opt.server_cert_file_._M_dataplus._M_p = (pointer)&asio_opt.server_cert_file_.field_2;
  asio_opt.worker_stop_._M_invoker._0_2_ = 0;
  asio_opt._66_8_ = 0;
  asio_opt.worker_stop_.super__Function_base._M_functor._8_8_ = 0;
  asio_opt.worker_stop_.super__Function_base._M_manager._0_2_ = 0;
  asio_opt.worker_stop_.super__Function_base._M_manager._2_6_ = 0;
  asio_opt.worker_start_._M_invoker = (_Invoker_type)0x0;
  asio_opt.worker_stop_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  asio_opt.worker_start_.super__Function_base._M_functor._8_8_ = 0;
  asio_opt.worker_start_.super__Function_base._M_manager = (_Manager_type)0x0;
  asio_opt.thread_pool_size_ = 0;
  asio_opt.worker_start_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  asio_opt.server_cert_file_._M_string_length = 0;
  asio_opt.server_cert_file_.field_2._M_local_buf[0] = '\0';
  asio_opt.server_key_file_._M_dataplus._M_p = (pointer)&asio_opt.server_key_file_.field_2;
  asio_opt.server_key_file_._M_string_length = 0;
  asio_opt.server_key_file_.field_2._M_local_buf[0] = '\0';
  asio_opt.root_cert_file_._M_dataplus._M_p = (pointer)&asio_opt.root_cert_file_.field_2;
  asio_opt.root_cert_file_._M_string_length = 0;
  asio_opt.root_cert_file_.field_2._M_local_buf[0] = '\0';
  asio_opt.write_req_meta_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  asio_opt.write_req_meta_.super__Function_base._M_functor._8_8_ = 0;
  asio_opt.write_req_meta_.super__Function_base._M_manager = (_Manager_type)0x0;
  asio_opt.write_req_meta_._M_invoker = (_Invoker_type)0x0;
  asio_opt.read_req_meta_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  asio_opt.read_req_meta_.super__Function_base._M_functor._8_8_ = 0;
  asio_opt.read_req_meta_.super__Function_base._M_manager = (_Manager_type)0x0;
  asio_opt.read_req_meta_._M_invoker = (_Invoker_type)0x0;
  asio_opt.invoke_req_cb_on_empty_meta_ = true;
  asio_opt.read_resp_meta_.super__Function_base._M_manager = (_Manager_type)0x0;
  asio_opt.read_resp_meta_._M_invoker = (_Invoker_type)0x0;
  asio_opt.read_resp_meta_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  asio_opt.read_resp_meta_.super__Function_base._M_functor._8_8_ = 0;
  asio_opt.write_resp_meta_.super__Function_base._M_manager = (_Manager_type)0x0;
  asio_opt.write_resp_meta_._M_invoker = (_Invoker_type)0x0;
  asio_opt.write_resp_meta_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  asio_opt.write_resp_meta_.super__Function_base._M_functor._8_8_ = 0;
  asio_opt.invoke_resp_cb_on_empty_meta_ = true;
  memset(&asio_opt.verify_sn_,0,0x81);
  local_2b8._0_8_ = 0xfa000001f4;
  local_2b8._8_8_ = (void *)0x320000007d;
  local_2b8._16_8_ = 0x1869f000003e8;
  local_2b8[0x20] = 0;
  local_2b8._24_8_ = (_Manager_type)0x0;
  local_2b8._36_8_ = 0x186a000000064;
  local_2b8._44_8_ = 0xc800000bb8;
  local_284 = 2000;
  local_280 = 0;
  uStack_278 = 0;
  local_270 = 1;
  local_26c = 10;
  local_268 = 1;
  local_266 = 0;
  local_264 = 1;
  local_260 = 0;
  uStack_259 = 0;
  uStack_258 = 0;
  nuraft::raft_launcher::raft_launcher(&launcher);
  std::__shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_2e0,&local_368);
  std::__shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_2f0,&local_378);
  std::__shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_300,&my_logger.super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>);
  msg._M_dataplus._M_p = msg._M_dataplus._M_p & 0xffffffffffffff00;
  msg._M_string_length = 0;
  msg.field_2._M_allocated_capacity = 0;
  msg.field_2._8_8_ = 0;
  nuraft::raft_launcher::init
            ((raft_launcher *)&server,(ptr<state_machine> *)&launcher,(ptr<state_mgr> *)&local_2e0,
             (ptr<logger> *)&local_2f0,(int)&local_300,(options *)0x3039,(raft_params *)&asio_opt,
             (init_options *)local_2b8);
  std::_Function_base::~_Function_base((_Function_base *)&msg._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_300._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2f0._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2e0._M_refcount);
  while ((((server.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          initialized_)._M_base._M_i & 1U) == 0) {
    msg._M_dataplus._M_p = (pointer)0x64;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&msg);
  }
  std::__cxx11::string::string((string *)&msg,"hello world",(allocator *)&bs_log);
  nuraft::buffer::alloc((buffer *)&log,msg._M_string_length + 4);
  nuraft::buffer_serializer::buffer_serializer(&bs_log,&log,LITTLE);
  nuraft::buffer_serializer::put_str(&bs_log,&msg);
  std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_340,&log.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_340;
  std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
  vector(&local_2d0,__l,&local_399);
  nuraft::raft_server::append_entries
            ((raft_server *)local_250,
             (vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
              *)server.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_250 + 8));
  std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
  ~vector(&local_2d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_340._M_refcount);
  nuraft::raft_launcher::shutdown(&launcher,5,__how);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&log.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&msg);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&server.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  nuraft::raft_launcher::~raft_launcher(&launcher);
  nuraft::asio_service_options::~asio_service_options(&asio_opt);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_378._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_368._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&my_logger.super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    // Replace with your logger, state machine, and state manager.
    ptr<logger>         my_logger = nullptr;
    ptr<state_machine>  my_state_machine = cs_new<echo_state_machine>();
    ptr<state_mgr>      my_state_manager =
        cs_new<inmem_state_mgr>(1, "localhost:12345");

    asio_service::options   asio_opt;   // your Asio options
    raft_params             params;     // your Raft parameters

    // Initialize Raft server listening on port 12345.
    // It will organize a single-node Raft cluster.
    raft_launcher       launcher;
    int                 port_number = 12345;
    ptr<raft_server>    server = launcher.init(my_state_machine,
                                               my_state_manager,
                                               my_logger,
                                               port_number,
                                               asio_opt,
                                               params);
    // Need to wait for initialization.
    while (!server->is_initialized()) {
        std::this_thread::sleep_for( std::chrono::milliseconds(100) );
    }

    // Append a log, containing a string `hello world` and its 4-byte length.
    std::string msg = "hello world";
    ptr<buffer> log = buffer::alloc(sizeof(int) + msg.size());
    buffer_serializer bs_log(log);
    bs_log.put_str(msg);
    server->append_entries({log});

    // Shutdown.
    launcher.shutdown();
    return 0;
}